

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticClient.cpp
# Opt level: O1

void __thiscall
slang::DiagnosticClient::getIncludeStack
          (DiagnosticClient *this,BufferID buffer,SmallVectorBase<slang::SourceLocation> *stack)

{
  SourceLocation in_RAX;
  SourceLocation SVar1;
  SourceLocation loc;
  SourceLocation local_38;
  
  stack->len = 0;
  local_38 = in_RAX;
  do {
    if (buffer.id == 0) {
      return;
    }
    SVar1 = SourceManager::getIncludedFrom(this->sourceManager,buffer);
    local_38 = SVar1;
    if (((ulong)SVar1 & 0xfffffff) != 0) {
      SmallVectorBase<slang::SourceLocation>::emplace_back<slang::SourceLocation_const&>
                (stack,&local_38);
      buffer.id = local_38._0_4_ & 0xfffffff;
    }
  } while (((ulong)SVar1 & 0xfffffff) != 0);
  return;
}

Assistant:

void DiagnosticClient::getIncludeStack(BufferID buffer,
                                       SmallVectorBase<SourceLocation>& stack) const {
    stack.clear();
    while (buffer) {
        SourceLocation loc = sourceManager->getIncludedFrom(buffer);
        if (!loc.buffer())
            break;

        stack.push_back(loc);
        buffer = loc.buffer();
    }
}